

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmhttpreq.cpp
# Opt level: O1

int __thiscall
CVmObjHTTPRequest::getp_getHeaders
          (CVmObjHTTPRequest *this,vm_obj_id_t self,vm_val_t *retval,uint *oargc)

{
  char *pcVar1;
  char *__s;
  long lVar2;
  anon_union_8_8_cb74652f_for_val aVar3;
  undefined4 uVar4;
  vm_val_t *pvVar5;
  int iVar6;
  vm_obj_id_t vVar7;
  size_t sVar8;
  size_t len;
  CVmObjLookupTable *tab;
  undefined8 *puVar9;
  vm_val_t local_40;
  
  if (getp_getHeaders(unsigned_int,vm_val_t*,unsigned_int*)::desc == '\0') {
    getp_getHeaders();
  }
  iVar6 = CVmObject::get_prop_check_argc(retval,oargc,&getp_getHeaders::desc);
  if (iVar6 == 0) {
    puVar9 = *(undefined8 **)(*(long *)(this->super_CVmObject).ext_ + 0x58);
    vVar7 = CVmObjLookupTable::create(0,0x20,0x40);
    retval->typ = VM_OBJ;
    (retval->val).obj = vVar7;
    pvVar5 = sp_;
    uVar4 = *(undefined4 *)&retval->field_0x4;
    aVar3 = retval->val;
    sp_ = sp_ + 1;
    pvVar5->typ = retval->typ;
    *(undefined4 *)&pvVar5->field_0x4 = uVar4;
    pvVar5->val = aVar3;
    tab = (CVmObjLookupTable *)
          ((long)&G_obj_table_X.pages_[(retval->val).obj >> 0xc]->ptr_ +
          (ulong)(((retval->val).obj & 0xfff) * 0x18));
    pcVar1 = (char *)*puVar9;
    sVar8 = strlen(pcVar1);
    local_40.typ = VM_INT;
    local_40.val.obj = 1;
    add_parsed_val(tab,&local_40,pcVar1,sVar8,0);
    for (puVar9 = (undefined8 *)puVar9[2]; puVar9 != (undefined8 *)0x0;
        puVar9 = (undefined8 *)puVar9[2]) {
      pcVar1 = (char *)*puVar9;
      sVar8 = strlen(pcVar1);
      __s = (char *)puVar9[1];
      len = strlen(__s);
      local_40.val.obj = CVmObjString::create(0,pcVar1,sVar8);
      local_40.typ = VM_OBJ;
      lVar2 = *(long *)((long)&G_obj_table_X.pages_[local_40.val.obj >> 0xc]
                               [local_40.val.obj & 0xfff].ptr_ + 8);
      pcVar1 = (char *)(lVar2 + 2);
      CCharmapToUni::validate(pcVar1,((lVar2 + sVar8) - (long)pcVar1) + 2);
      add_parsed_val(tab,&local_40,__s,len,0);
    }
    sp_ = sp_ + -1;
  }
  return 1;
}

Assistant:

int CVmObjHTTPRequest::getp_getHeaders(VMG_ vm_obj_id_t self,
                                       vm_val_t *retval, uint *oargc)
{
    static CVmNativeCodeDesc desc(0);
    if (get_prop_check_argc(retval, oargc, &desc))
        return TRUE;

    /* retrieve the headers from the request */
    TadsHttpRequest *req = get_ext()->req;
    TadsHttpRequestHeader *hdrs = req->hdr_list;

    /* create a lookup table to hold the result; push it for gc protection */
    retval->set_obj(CVmObjLookupTable::create(vmg_ FALSE, 32, 64));
    G_stk->push(retval);
    CVmObjLookupTable *tab =
        (CVmObjLookupTable *)vm_objp(vmg_ retval->val.obj);

    /* 
     *   The first item in the list is the special "request line," with the
     *   HTTP verb and resource name; it's not really a header, as it doesn't
     *   have a name/value pair, so we file it under the key [1]. 
     */
    add_parsed_val(vmg_ tab, 1, hdrs->name, strlen(hdrs->name), ENCMODE_NONE);

    /* add the rest as key/value pairs */
    for (hdrs = hdrs->nxt ; hdrs != 0 ; hdrs = hdrs->nxt)
        add_parsed_val(vmg_ tab, hdrs->name, strlen(hdrs->name),
                       hdrs->value, strlen(hdrs->value), ENCMODE_NONE);

    /* done with the gc protection */
    G_stk->discard();

    /* handled */
    return TRUE;
}